

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_hashtable_remove(arg_hashtable_t *h,void *k)

{
  arg_hashtable_entry *__ptr;
  uint uVar1;
  int iVar2;
  arg_hashtable_entry **ppaVar3;
  
  uVar1 = enhanced_hash(h,k);
  ppaVar3 = h->table + (ulong)uVar1 % (ulong)h->tablelength;
  do {
    __ptr = *ppaVar3;
    if (__ptr == (arg_hashtable_entry *)0x0) {
      return;
    }
    if (uVar1 == __ptr->h) {
      iVar2 = (*h->eqfn)(k,__ptr->k);
      if (iVar2 != 0) {
        *ppaVar3 = __ptr->next;
        h->entrycount = h->entrycount - 1;
        free(__ptr->k);
        free(__ptr->v);
        free(__ptr);
        return;
      }
    }
    ppaVar3 = &__ptr->next;
  } while( true );
}

Assistant:

void arg_hashtable_remove(arg_hashtable_t* h, const void* k) {
    /*
     * TODO: consider compacting the table when the load factor drops enough,
     *       or provide a 'compact' method.
     */

    struct arg_hashtable_entry* e;
    struct arg_hashtable_entry** pE;
    unsigned int hashvalue;
    unsigned int index;

    hashvalue = enhanced_hash(h, k);
    index = index_for(h->tablelength, hashvalue);
    pE = &(h->table[index]);
    e = *pE;
    while (NULL != e) {
        /* Check hash value to short circuit heavier comparison */
        if ((hashvalue == e->h) && (h->eqfn(k, e->k))) {
            *pE = e->next;
            h->entrycount--;
            xfree(e->k);
            xfree(e->v);
            xfree(e);
            return;
        }
        pE = &(e->next);
        e = e->next;
    }
}